

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathQuat.h
# Opt level: O2

float Imath_2_5::angle4D<float>(Quat<float> *q1,Quat<float> *q2)

{
  float fVar1;
  float fVar2;
  Quat<float> s;
  Quat<float> d;
  Quat<float> local_38;
  Quat<float> local_28;
  
  operator-(q1,q2);
  fVar1 = operator^(&local_28,&local_28);
  if (fVar1 < 0.0) {
    fVar1 = sqrtf(fVar1);
  }
  else {
    fVar1 = SQRT(fVar1);
  }
  operator+(q1,q2);
  fVar2 = operator^(&local_38,&local_38);
  if (fVar2 < 0.0) {
    fVar2 = sqrtf(fVar2);
  }
  else {
    fVar2 = SQRT(fVar2);
  }
  fVar1 = atan2f(fVar1,fVar2);
  return fVar1 + fVar1;
}

Assistant:

T
angle4D (const Quat<T> &q1, const Quat<T> &q2)
{
    //
    // Compute the angle between two quaternions,
    // interpreting the quaternions as 4D vectors.
    //

    Quat<T> d = q1 - q2;
    T lengthD = Math<T>::sqrt (d ^ d);

    Quat<T> s = q1 + q2;
    T lengthS = Math<T>::sqrt (s ^ s);

    return 2 * Math<T>::atan2 (lengthD, lengthS);
}